

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::MatchExpr<FlatMap<Point,_double,_PointCmp>,_EqualsRange<FlatMap<Point,_double,_PointCmp>_>_>
::MatchExpr(MatchExpr<FlatMap<Point,_double,_PointCmp>,_EqualsRange<FlatMap<Point,_double,_PointCmp>_>_>
            *this,FlatMap<Point,_double,_PointCmp> *arg,
           EqualsRange<FlatMap<Point,_double,_PointCmp>_> *matcher,StringRef *matcherString)

{
  size_type sVar1;
  int iVar2;
  
  iVar2 = (*(matcher->super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>).super_MatcherUntypedBase
            ._vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar2,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0027a1c8;
  this->m_arg = arg;
  EqualsRange<FlatMap<Point,_double,_PointCmp>_>::EqualsRange(&this->m_matcher,matcher);
  sVar1 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar1;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}